

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::CleanupWindowContours(ContourVector *contours)

{
  bool bVar1;
  reference window_00;
  char *sx;
  ProjectedWindowContour *window;
  iterator __end2;
  iterator __begin2;
  ContourVector *__range2;
  ContourVector *contours_local;
  
  __end2 = std::
           vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
           ::begin(contours);
  window = (ProjectedWindowContour *)
           std::
           vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
           ::end(contours);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                                *)&window);
    if (!bVar1) break;
    window_00 = __gnu_cxx::
                __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                ::operator*(&__end2);
    CleanupWindowContour(window_00);
    __gnu_cxx::
    __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void CleanupWindowContours(ContourVector& contours)
{
    // Use PolyClipper to clean up window contours
    try {
        for(ProjectedWindowContour& window : contours) {
            CleanupWindowContour(window);
        }
    }
    catch (const char* sx) {
        IFCImporter::LogError("error during polygon clipping, window shape may be wrong: (Clipper: "
            + std::string(sx) + ")");
    }
}